

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderCommonFunctionTests.cpp
# Opt level: O0

float deqp::gles3::Functional::roundEven(float v)

{
  float fVar1;
  int local_20;
  int local_1c;
  int rounded;
  int truncated;
  float q;
  float v_local;
  
  fVar1 = deFloatFrac(v);
  local_20 = (int)(v - fVar1);
  if (fVar1 <= 0.5) {
    if (((fVar1 == 0.5) && (!NAN(fVar1))) && (local_20 % 2 != 0)) {
      local_20 = local_20 + 1;
    }
    local_1c = local_20;
  }
  else {
    local_1c = local_20 + 1;
  }
  return (float)local_1c;
}

Assistant:

static float roundEven (float v)
{
	const float		q			= deFloatFrac(v);
	const int		truncated	= int(v-q);
	const int		rounded		= (q > 0.5f)							? (truncated + 1) :	// Rounded up
									(q == 0.5f && (truncated % 2 != 0))	? (truncated + 1) :	// Round to nearest even at 0.5
									truncated;												// Rounded down

	return float(rounded);
}